

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
BinaryExpr<const_std::array<std::pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>_&,_const_std::array<std::pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::array<std::pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>_&,_const_std::array<std::pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *in_RCX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::
  rangeToString<std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*,std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*>
            (&local_40,(Detail *)this->m_lhs,
             (pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
             ((Detail *)this->m_lhs + 0x48),in_RCX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::
  rangeToString<std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*,std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*>
            (&local_60,(Detail *)this->m_rhs,
             (pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
             ((Detail *)this->m_rhs + 0x48),in_RCX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }